

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O0

TAttributeType __thiscall
glslang::TParseContext::attributeFromName(TParseContext *this,TString *name)

{
  bool bVar1;
  TString *name_local;
  TParseContext *this_local;
  
  bVar1 = std::operator==(name,"branch");
  if ((bVar1) || (bVar1 = std::operator==(name,"dont_flatten"), bVar1)) {
    return EatBranch;
  }
  bVar1 = std::operator==(name,"flatten");
  if (bVar1) {
    return EatFlatten;
  }
  bVar1 = std::operator==(name,"unroll");
  if (bVar1) {
    return EatUnroll;
  }
  bVar1 = std::operator==(name,"loop");
  if ((bVar1) || (bVar1 = std::operator==(name,"dont_unroll"), bVar1)) {
    return EatLoop;
  }
  bVar1 = std::operator==(name,"dependency_infinite");
  if (bVar1) {
    return EatDependencyInfinite;
  }
  bVar1 = std::operator==(name,"dependency_length");
  if (bVar1) {
    return EatDependencyLength;
  }
  bVar1 = std::operator==(name,"min_iterations");
  if (bVar1) {
    return EatMinIterations;
  }
  bVar1 = std::operator==(name,"max_iterations");
  if (bVar1) {
    return EatMaxIterations;
  }
  bVar1 = std::operator==(name,"iteration_multiple");
  if (bVar1) {
    return EatIterationMultiple;
  }
  bVar1 = std::operator==(name,"peel_count");
  if (bVar1) {
    return EatPeelCount;
  }
  bVar1 = std::operator==(name,"partial_count");
  if (bVar1) {
    return EatPartialCount;
  }
  bVar1 = std::operator==(name,"subgroup_uniform_control_flow");
  if (bVar1) {
    return EatSubgroupUniformControlFlow;
  }
  bVar1 = std::operator==(name,"export");
  if (bVar1) {
    return EatExport;
  }
  bVar1 = std::operator==(name,"maximally_reconverges");
  if (!bVar1) {
    return EatNone;
  }
  return EatMaximallyReconverges;
}

Assistant:

TAttributeType TParseContext::attributeFromName(const TString& name) const
{
    if (name == "branch" || name == "dont_flatten")
        return EatBranch;
    else if (name == "flatten")
        return EatFlatten;
    else if (name == "unroll")
        return EatUnroll;
    else if (name == "loop" || name == "dont_unroll")
        return EatLoop;
    else if (name == "dependency_infinite")
        return EatDependencyInfinite;
    else if (name == "dependency_length")
        return EatDependencyLength;
    else if (name == "min_iterations")
        return EatMinIterations;
    else if (name == "max_iterations")
        return EatMaxIterations;
    else if (name == "iteration_multiple")
        return EatIterationMultiple;
    else if (name == "peel_count")
        return EatPeelCount;
    else if (name == "partial_count")
        return EatPartialCount;
    else if (name == "subgroup_uniform_control_flow")
        return EatSubgroupUniformControlFlow;
    else if (name == "export")
        return EatExport;
    else if (name == "maximally_reconverges")
        return EatMaximallyReconverges;
    else
        return EatNone;
}